

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::ensureTagClosed(XmlWriter *this)

{
  ostream *this_00;
  XmlWriter *in_RDI;
  
  if ((in_RDI->m_tagIsOpen & 1U) != 0) {
    this_00 = std::operator<<((ostream *)in_RDI->m_os,'>');
    std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
    newlineIfNecessary(in_RDI);
    in_RDI->m_tagIsOpen = false;
  }
  return;
}

Assistant:

void XmlWriter::ensureTagClosed() {
        if( m_tagIsOpen ) {
            m_os << '>' << std::flush;
            newlineIfNecessary();
            m_tagIsOpen = false;
        }
    }